

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBar.cpp
# Opt level: O3

double __thiscall chrono::fea::ChElementBar::GetCurrentForce(ChElementBar *this)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar2 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar3 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  dVar11 = *(double *)&peVar2->field_0x28 - *(double *)&peVar3->field_0x28;
  dVar4 = *(double *)((long)&peVar2->super_ChNodeFEAbase + 0x20) -
          *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  dVar5 = *(double *)&peVar2->field_0x30 - *(double *)&peVar3->field_0x30;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar4;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar11 * dVar11;
  auVar7 = vfmadd231sd_fma(auVar19,auVar9,auVar9);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar5;
  auVar7 = vfmadd231sd_fma(auVar7,auVar15,auVar15);
  auVar7 = vsqrtsd_avx(auVar7,auVar7);
  bVar8 = 2.2250738585072014e-308 <= auVar7._0_8_;
  dVar18 = 1.0 / auVar7._0_8_;
  (**(code **)(*(long *)&peVar2->super_ChNodeFEAbase + 0x60))(&local_30);
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_48);
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_28;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_30;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_48;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_40;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_20;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_38;
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)&peVar3->field_0x28;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)&peVar3->field_0x30;
  auVar6 = vunpcklpd_avx(auVar27,auVar12);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)((long)&peVar2->super_ChNodeFEAbase + 0x20);
  auVar7 = vunpcklpd_avx(auVar26,auVar10);
  auVar9 = vunpcklpd_avx(auVar29,auVar16);
  auVar10 = vunpcklpd_avx(auVar28,auVar20);
  auVar7 = vsubpd_avx(auVar7,auVar10);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)&peVar2->field_0x28;
  auVar10 = vunpcklpd_avx(auVar21,auVar24);
  auVar6 = vsubpd_avx(auVar6,auVar10);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)&peVar2->field_0x30;
  auVar13._0_8_ = auVar6._0_8_ * auVar6._0_8_;
  auVar13._8_8_ = auVar6._8_8_ * auVar6._8_8_;
  auVar6 = vfmadd231pd_fma(auVar13,auVar7,auVar7);
  auVar7 = vunpcklpd_avx(auVar22,auVar25);
  auVar7 = vsubpd_avx(auVar9,auVar7);
  auVar7 = vfmadd231pd_fma(auVar6,auVar7,auVar7);
  auVar9 = vsqrtpd_avx(auVar7);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (ulong)bVar8 * (long)(dVar4 * dVar18) + (ulong)!bVar8 * 0x3ff0000000000000;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(double *)&peVar3->field_0x38 - *(double *)&peVar2->field_0x38;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (*(double *)&peVar3->field_0x40 - *(double *)&peVar2->field_0x40) *
       (double)((ulong)bVar8 * (long)(dVar11 * dVar18));
  auVar7 = vfmadd231sd_fma(auVar17,auVar14,auVar7);
  dVar11 = (this->area * this->E) / this->length;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (ulong)bVar8 * (long)(dVar5 * dVar18);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(double *)&peVar3->field_0x48 - *(double *)&peVar2->field_0x48;
  auVar6 = vfmadd231sd_fma(auVar7,auVar23,auVar6);
  auVar7 = vhsubpd_avx(auVar9,auVar9);
  return auVar7._0_8_ * dVar11 + auVar6._0_8_ * dVar11 * this->rdamping;
}

Assistant:

double ChElementBar::GetCurrentForce() {
	ChVector<> dir = (nodes[1]->GetPos() - nodes[0]->GetPos()).GetNormalized();
    double L_ref = (nodes[1]->GetX0() - nodes[0]->GetX0()).Length();
    double L = (nodes[1]->GetPos() - nodes[0]->GetPos()).Length();
    double L_dt = Vdot((nodes[1]->GetPos_dt() - nodes[0]->GetPos_dt()), dir);
    double Kstiffness = ((this->area * this->E) / this->length);
    double Rdamping = this->rdamping * Kstiffness;
    double internal_Kforce_local = Kstiffness * (L - L_ref);
    double internal_Rforce_local = Rdamping * L_dt;
    return internal_Kforce_local + internal_Rforce_local;
}